

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O3

int __thiscall fmt::v5::file::dup(file *this,int __fd)

{
  int iVar1;
  system_error *this_00;
  int *piVar2;
  string_view message;
  int local_14;
  
  iVar1 = ::dup(__fd);
  if (iVar1 != -1) {
    this->fd_ = iVar1;
    return (int)this;
  }
  this_00 = (system_error *)__cxa_allocate_exception(0x18);
  piVar2 = __errno_location();
  message.size_ = 0x23;
  message.data_ = "cannot duplicate file descriptor {}";
  system_error::system_error<int>(this_00,*piVar2,message,&local_14);
  __cxa_throw(this_00,&system_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

file file::dup(int fd) {
  // Don't retry as dup doesn't return EINTR.
  // http://pubs.opengroup.org/onlinepubs/009695399/functions/dup.html
  int new_fd = FMT_POSIX_CALL(dup(fd));
  if (new_fd == -1)
    FMT_THROW(system_error(errno, "cannot duplicate file descriptor {}", fd));
  return file(new_fd);
}